

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cencode.c
# Opt level: O0

void rcnb_encode_short(unsigned_short value_in,wchar_t **value_out)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  bool bVar3;
  _Bool reverse;
  wchar_t **value_out_local;
  unsigned_short value_in_local;
  
  bVar3 = 0x7fff < value_in;
  if (bVar3) {
    value_in = value_in & 0x7fff;
    *value_out = *value_out + 2;
  }
  wVar1 = L"rRŔŕŖŗŘřƦȐȑȒȓɌɍ"[(int)(value_in / 0x8ca)];
  pwVar2 = *value_out;
  *value_out = pwVar2 + 1;
  *pwVar2 = wVar1;
  wVar1 = L"cCĆćĈĉĊċČčƇƈÇȻȼ"[(int)(((ulong)value_in % 0x8ca) / 0x96)];
  pwVar2 = *value_out;
  *value_out = pwVar2 + 1;
  *pwVar2 = wVar1;
  if (bVar3) {
    *value_out = *value_out + -4;
  }
  wVar1 = L"nNŃńŅņŇňƝƞÑǸǹȠȵ"[(int)(((ulong)value_in % 0x96) / 10)];
  pwVar2 = *value_out;
  *value_out = pwVar2 + 1;
  *pwVar2 = wVar1;
  wVar1 = L"bBƀƁƃƄƅßÞþ"[(int)((uint)value_in % 10)];
  pwVar2 = *value_out;
  *value_out = pwVar2 + 1;
  *pwVar2 = wVar1;
  if (bVar3) {
    *value_out = *value_out + 2;
  }
  return;
}

Assistant:

void rcnb_encode_short(unsigned short value_in, wchar_t** value_out)
{
    bool reverse = false;
    if (value_in > 0x7FFF) {
        reverse = true;
        value_in = (unsigned short)(value_in & 0x7FFF);
    }
    if (reverse)
        *value_out += 2;
    *(*value_out)++ = cr[value_in / scnb];
    *(*value_out)++ = cc[value_in % scnb / snb];
    if (reverse)
        *value_out -= 4;
    *(*value_out)++ = cn[value_in % snb / sb];
    *(*value_out)++ = cb[value_in % sb];
    if (reverse)
        *value_out += 2;
}